

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondJump.cpp
# Opt level: O2

void __thiscall
OpenMD::HBondJump::processOverlapping(HBondJump *this,int frame,SelectionManager *sman)

{
  int iVar1;
  Molecule *pMVar2;
  pointer ppAVar3;
  pointer ppHVar4;
  Atom *pAVar5;
  HBondDonor *pHVar6;
  pointer ppAVar7;
  size_type sVar8;
  pointer ppHVar9;
  reference rVar10;
  int j;
  int i;
  int local_50;
  int local_4c;
  pointer local_48;
  Molecule *local_40;
  SelectionManager *local_38;
  
  local_40 = SelectionManager::beginSelectedMolecule(sman,&local_4c);
  local_38 = sman;
  while (local_40 != (Molecule *)0x0) {
    ppAVar7 = (pointer)(local_40->hBondDonors_).
                       super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
    if (ppAVar7 !=
        (pointer)(local_40->hBondDonors_).
                 super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00134799;
    pAVar5 = (Atom *)0x0;
    while (pAVar5 != (Atom *)0x0) {
      sVar8 = (size_type)
              *(int *)(*(long *)&(this->GIDtoH_).
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[frame].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data +
                      (long)*(int *)(*(long *)&(pAVar5->super_StuntDouble).objType_ + 0x28) * 4);
      iVar1 = *(int *)(*(long *)&(this->acceptor_).
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[frame].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + sVar8 * 4);
      local_50 = local_4c;
      local_48 = ppAVar7;
      while( true ) {
        sman = local_38;
        pMVar2 = SelectionManager::nextSelectedMolecule(local_38,&local_50);
        if (pMVar2 == (Molecule *)0x0) break;
        ppAVar7 = (pMVar2->hBondAcceptors_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppAVar3 = (pMVar2->hBondAcceptors_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (ppAVar7 != ppAVar3) goto LAB_00134774;
        pAVar5 = (Atom *)0x0;
        while (pAVar5 != (Atom *)0x0) {
          if ((pAVar5->super_StuntDouble).globalIndex_ == iVar1) {
            rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((this->selected_).
                                super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + frame,sVar8);
            *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
            ppAVar3 = (pMVar2->hBondAcceptors_).
                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          ppAVar7 = ppAVar7 + 1;
          pAVar5 = (Atom *)0x0;
          if (ppAVar7 != ppAVar3) {
LAB_00134774:
            pAVar5 = *ppAVar7;
          }
        }
      }
      ppAVar7 = local_48 + 1;
      pAVar5 = (Atom *)0x0;
      if (ppAVar7 !=
          (pointer)(local_40->hBondDonors_).
                   super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00134799:
        pAVar5 = *ppAVar7;
      }
    }
    ppAVar7 = (local_40->hBondAcceptors_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppAVar7 !=
        (local_40->hBondAcceptors_).
        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_0013487a;
    pAVar5 = (Atom *)0x0;
    while (pAVar5 != (Atom *)0x0) {
      iVar1 = (pAVar5->super_StuntDouble).globalIndex_;
      local_50 = local_4c;
      local_48 = ppAVar7;
      while( true ) {
        pMVar2 = SelectionManager::nextSelectedMolecule(sman,&local_50);
        if (pMVar2 == (Molecule *)0x0) break;
        ppHVar9 = (pMVar2->hBondDonors_).
                  super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppHVar4 = (pMVar2->hBondDonors_).
                  super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if (ppHVar9 != ppHVar4) goto LAB_00134854;
        pHVar6 = (HBondDonor *)0x0;
        while (pHVar6 != (HBondDonor *)0x0) {
          sVar8 = (size_type)
                  *(int *)(*(long *)&(this->GIDtoH_).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[frame].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data +
                          (long)(pHVar6->donatedHydrogen->super_StuntDouble).globalIndex_ * 4);
          if (*(int *)(*(long *)&(this->acceptor_).
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[frame].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data + sVar8 * 4) == iVar1) {
            rVar10 = std::vector<bool,_std::allocator<bool>_>::operator[]
                               ((this->selected_).
                                super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + frame,sVar8);
            *rVar10._M_p = *rVar10._M_p | rVar10._M_mask;
            ppHVar4 = (pMVar2->hBondDonors_).
                      super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          ppHVar9 = ppHVar9 + 1;
          pHVar6 = (HBondDonor *)0x0;
          if (ppHVar9 != ppHVar4) {
LAB_00134854:
            pHVar6 = *ppHVar9;
          }
        }
      }
      ppAVar7 = local_48 + 1;
      pAVar5 = (Atom *)0x0;
      if (ppAVar7 !=
          (local_40->hBondAcceptors_).
          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
LAB_0013487a:
        pAVar5 = *ppAVar7;
      }
    }
    local_40 = SelectionManager::nextSelectedMolecule(sman,&local_4c);
  }
  return;
}

Assistant:

void HBondJump::processOverlapping(int frame, SelectionManager& sman) {
    Molecule* mol1;
    Molecule* mol2;
    int i, j;

    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    Molecule::HBondDonor* hbd;
    std::vector<Atom*>::iterator hbai;
    Atom* hba;
    int hInd, index, aInd;

    // This is the same as a pairwise loop structure:
    // for (int i = 0;  i < n-1 ; ++i ) {
    //   for (int j = i + 1; j < n; ++j) {}
    // }

    for (mol1 = sman.beginSelectedMolecule(i); mol1 != NULL;
         mol1 = sman.nextSelectedMolecule(i)) {
      // loop over the possible donors in molecule 1:
      for (hbd = mol1->beginHBondDonor(hbdi); hbd != NULL;
           hbd = mol1->nextHBondDonor(hbdi)) {
        hInd  = hbd->donatedHydrogen->getGlobalIndex();
        index = GIDtoH_[frame][hInd];
        aInd  = acceptor_[frame][index];

        for (j = i, mol2 = sman.nextSelectedMolecule(j); mol2 != NULL;
             mol2 = sman.nextSelectedMolecule(j)) {
          for (hba = mol2->beginHBondAcceptor(hbai); hba != NULL;
               hba = mol2->nextHBondAcceptor(hbai)) {
            if (hba->getGlobalIndex() == aInd) {
              selected_[frame][index] = true;
            }
          }
        }
      }

      for (hba = mol1->beginHBondAcceptor(hbai); hba != NULL;
           hba = mol1->nextHBondAcceptor(hbai)) {
        aInd = hba->getGlobalIndex();

        for (j = i, mol2 = sman.nextSelectedMolecule(j); mol2 != NULL;
             mol2 = sman.nextSelectedMolecule(j)) {
          for (hbd = mol2->beginHBondDonor(hbdi); hbd != NULL;
               hbd = mol2->nextHBondDonor(hbdi)) {
            hInd  = hbd->donatedHydrogen->getGlobalIndex();
            index = GIDtoH_[frame][hInd];

            if (acceptor_[frame][index] == aInd) {
              selected_[frame][index] = true;
            }
          }
        }
      }
    }
  }